

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void eigensystem(double *mat,int N,double *eval,double *evec)

{
  ulong uVar1;
  uint uVar2;
  undefined8 *__dest;
  long lVar3;
  int iVar4;
  ulong uVar5;
  double *pdVar6;
  undefined8 *puVar7;
  double *pdVar8;
  long lVar9;
  double *pdVar10;
  ulong uVar11;
  ulong uVar12;
  double *pdVar13;
  ulong uVar14;
  long lVar15;
  size_t __nmemb;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  int local_f8;
  double *local_88;
  int local_74;
  ulong local_38;
  
  uVar18 = (ulong)(uint)N;
  __nmemb = (size_t)N;
  __dest = (undefined8 *)calloc(__nmemb,8);
  memcpy(evec,mat,__nmemb * __nmemb * 8);
  if (1 < N) {
    uVar16 = (ulong)(N - 1);
    pdVar10 = evec + (uVar18 - 1) * uVar18;
    uVar12 = uVar18;
    do {
      uVar17 = uVar12 - 1;
      lVar3 = uVar17 * uVar18;
      if (uVar12 == 2) {
LAB_0011e6ff:
        __dest[uVar17] = evec[lVar3];
        dVar26 = 0.0;
      }
      else {
        dVar24 = 0.0;
        uVar5 = 0;
        do {
          dVar24 = dVar24 + ABS(pdVar10[uVar5]);
          uVar5 = uVar5 + 1;
        } while (uVar16 != uVar5);
        if ((dVar24 == 0.0) && (!NAN(dVar24))) {
          lVar3 = lVar3 + (uVar12 - 2);
          goto LAB_0011e6ff;
        }
        dVar26 = 0.0;
        uVar5 = 0;
        do {
          dVar25 = pdVar10[uVar5] / dVar24;
          pdVar10[uVar5] = dVar25;
          dVar26 = dVar26 + dVar25 * dVar25;
          uVar5 = uVar5 + 1;
        } while (uVar16 != uVar5);
        dVar25 = evec[lVar3 + (uVar12 - 2)];
        if (dVar26 < 0.0) {
          dVar20 = sqrt(dVar26);
        }
        else {
          dVar20 = SQRT(dVar26);
        }
        dVar27 = 0.0;
        dVar20 = (double)(~-(ulong)(dVar25 < 0.0) & (ulong)-dVar20 |
                         -(ulong)(dVar25 < 0.0) & (ulong)dVar20);
        __dest[uVar17] = dVar24 * dVar20;
        dVar26 = dVar26 - dVar25 * dVar20;
        evec[lVar3 + (uVar12 - 2)] = dVar25 - dVar20;
        iVar4 = 1;
        uVar5 = 0;
        pdVar6 = evec;
        pdVar8 = evec;
        do {
          uVar11 = (long)iVar4 - 1;
          pdVar13 = (double *)(uVar18 * 8 * (long)iVar4 + (long)pdVar6);
          evec[uVar17 + uVar5 * uVar18] = evec[lVar3 + uVar5] / dVar26;
          uVar14 = 0xffffffffffffffff;
          dVar24 = 0.0;
          do {
            dVar24 = dVar24 + pdVar8[uVar14 + 1] * pdVar10[uVar14 + 1];
            uVar14 = uVar14 + 1;
            uVar1 = uVar5;
          } while (uVar5 != uVar14);
          while ((long)uVar1 < (long)(uVar12 - 2)) {
            dVar24 = dVar24 + *pdVar13 * pdVar10[uVar11 + 1];
            pdVar13 = pdVar13 + uVar18;
            uVar11 = uVar11 + 1;
            uVar1 = uVar11;
          }
          __dest[uVar5] = dVar24 / dVar26;
          lVar15 = lVar3 + uVar5;
          uVar5 = uVar5 + 1;
          dVar27 = dVar27 + (dVar24 / dVar26) * evec[lVar15];
          iVar4 = iVar4 + 1;
          pdVar8 = pdVar8 + uVar18;
          pdVar6 = pdVar6 + 1;
        } while (uVar5 != uVar16);
        lVar15 = 1;
        uVar5 = 0;
        pdVar6 = evec;
        do {
          dVar24 = evec[lVar3 + uVar5];
          dVar25 = (-dVar27 / (dVar26 + dVar26)) * dVar24 + (double)__dest[uVar5];
          __dest[uVar5] = dVar25;
          lVar9 = 0;
          do {
            pdVar6[lVar9] =
                 pdVar6[lVar9] - ((double)__dest[lVar9] * dVar24 + pdVar10[lVar9] * dVar25);
            lVar9 = lVar9 + 1;
          } while (lVar15 != lVar9);
          uVar5 = uVar5 + 1;
          lVar15 = lVar15 + 1;
          pdVar6 = pdVar6 + uVar18;
        } while (uVar5 != uVar16);
      }
      eval[uVar17] = dVar26;
      uVar16 = uVar16 - 1;
      pdVar10 = pdVar10 + -uVar18;
      bVar19 = 2 < (long)uVar12;
      uVar12 = uVar17;
    } while (bVar19);
  }
  *eval = 0.0;
  *__dest = 0;
  if (0 < N) {
    uVar12 = 0;
    pdVar10 = evec;
    pdVar6 = evec;
    do {
      if ((uVar12 != 0) && ((eval[uVar12] != 0.0 || (NAN(eval[uVar12]))))) {
        uVar16 = 0;
        pdVar8 = evec;
        do {
          dVar24 = 0.0;
          uVar17 = 0;
          pdVar13 = pdVar8;
          do {
            dVar24 = dVar24 + pdVar6[uVar17] * *pdVar13;
            uVar17 = uVar17 + 1;
            pdVar13 = pdVar13 + uVar18;
          } while (uVar12 != uVar17);
          lVar3 = 0;
          uVar17 = uVar12;
          do {
            *(double *)((long)pdVar8 + lVar3) =
                 *(double *)((long)pdVar10 + lVar3) * -dVar24 + *(double *)((long)pdVar8 + lVar3);
            lVar3 = lVar3 + uVar18 * 8;
            uVar17 = uVar17 - 1;
          } while (uVar17 != 0);
          uVar16 = uVar16 + 1;
          pdVar8 = pdVar8 + 1;
        } while (uVar16 != uVar12);
      }
      uVar16 = (ulong)(uint)((int)uVar12 * N);
      eval[uVar12] = evec[uVar12 + uVar16];
      evec[uVar12 + uVar16] = 1.0;
      if (uVar12 != 0) {
        uVar16 = 0;
        pdVar8 = pdVar10;
        do {
          pdVar6[uVar16] = 0.0;
          *pdVar8 = 0.0;
          uVar16 = uVar16 + 1;
          pdVar8 = pdVar8 + uVar18;
        } while (uVar12 != uVar16);
      }
      uVar12 = uVar12 + 1;
      pdVar6 = pdVar6 + uVar18;
      pdVar10 = pdVar10 + 1;
    } while (uVar12 != uVar18);
  }
  if (1 < N) {
    memmove(__dest,__dest + 1,(ulong)(N - 1) << 3);
  }
  __dest[__nmemb - 1] = 0;
  if (0 < N) {
    uVar12 = (ulong)(N - 1U);
    iVar4 = 1;
    local_38 = 0;
    puVar7 = __dest;
    pdVar10 = eval;
    do {
      local_74 = 0;
      do {
        uVar16 = 0;
        do {
          uVar2 = N - 1U;
          if (uVar12 == uVar16) goto LAB_0011eb7e;
          dVar24 = ABS((pdVar10 + 1)[uVar16]) + ABS(pdVar10[uVar16]);
          pdVar6 = (double *)(puVar7 + uVar16);
          uVar16 = uVar16 + 1;
        } while ((ABS(*pdVar6) + dVar24 != dVar24) || (NAN(ABS(*pdVar6) + dVar24) || NAN(dVar24)));
        uVar2 = (int)uVar16 - iVar4;
LAB_0011eb7e:
        uVar16 = (ulong)uVar2;
        if (local_38 != uVar16) {
          if (local_74 == 0x1e) {
            printf("Too many iterations in tqli");
          }
          dVar24 = (double)__dest[local_38];
          dVar25 = (eval[local_38 + 1] - eval[local_38]) / (dVar24 + dVar24);
          dVar26 = ABS(dVar25);
          if (dVar26 <= 1.0) {
            dVar26 = dVar25 * dVar25 + 1.0;
            if (dVar26 < 0.0) {
              dVar26 = sqrt(dVar26);
            }
            else {
              dVar26 = SQRT(dVar26);
            }
          }
          else {
            dVar20 = (1.0 / dVar26) * (1.0 / dVar26) + 1.0;
            if (dVar20 < 0.0) {
              dVar20 = sqrt(dVar20);
            }
            else {
              dVar20 = SQRT(dVar20);
            }
            dVar26 = dVar26 * dVar20;
          }
          dVar20 = 0.0;
          dVar24 = dVar24 / ((double)(~-(ulong)(dVar25 < 0.0) & (ulong)ABS(dVar26) |
                                     ((ulong)dVar26 | (ulong)DAT_001530d0) & -(ulong)(dVar25 < 0.0))
                            + dVar25) + (eval[uVar16] - eval[local_38]);
          bVar19 = uVar16 <= local_38;
          if (!bVar19) {
            local_88 = evec + (long)(int)uVar2 + -1;
            lVar15 = uVar16 << 0x20;
            bVar19 = false;
            dVar27 = 1.0;
            dVar25 = 1.0;
            lVar3 = (long)(int)uVar2;
            do {
              dVar22 = (double)__dest[lVar3 + -1];
              dVar25 = dVar25 * dVar22;
              dVar23 = ABS(dVar25);
              dVar21 = ABS(dVar24);
              if (dVar23 <= dVar21) {
                dVar26 = 0.0;
                if ((dVar24 != 0.0) || (NAN(dVar24))) {
                  dVar26 = (dVar23 / dVar21) * (dVar23 / dVar21);
                  goto LAB_0011ee02;
                }
              }
              else {
                dVar26 = (dVar21 / dVar23) * (dVar21 / dVar23);
                dVar21 = dVar23;
LAB_0011ee02:
                dVar26 = dVar26 + 1.0;
                if (dVar26 < 0.0) {
                  dVar26 = sqrt(dVar26);
                }
                else {
                  dVar26 = SQRT(dVar26);
                }
                dVar26 = dVar21 * dVar26;
              }
              __dest[lVar3] = dVar26;
              if ((dVar26 == 0.0) && (!NAN(dVar26))) {
                eval[lVar3] = eval[lVar3] - dVar20;
                __dest[uVar16] = 0;
                break;
              }
              lVar9 = lVar3 + -1;
              dVar22 = dVar27 * dVar22;
              dVar25 = dVar25 / dVar26;
              dVar27 = dVar24 / dVar26;
              dVar24 = eval[lVar3] - dVar20;
              dVar26 = (eval[lVar9] - dVar24) * dVar25 + (dVar27 + dVar27) * dVar22;
              dVar20 = dVar25 * dVar26;
              eval[lVar3] = dVar24 + dVar20;
              lVar3 = lVar15;
              pdVar6 = local_88;
              uVar17 = uVar18;
              do {
                dVar24 = *(double *)((long)evec + (lVar3 >> 0x1d));
                dVar21 = *pdVar6;
                *(double *)((long)evec + (lVar3 >> 0x1d)) = dVar25 * dVar21 + dVar27 * dVar24;
                *pdVar6 = dVar21 * dVar27 + dVar24 * -dVar25;
                pdVar6 = pdVar6 + uVar18;
                lVar3 = lVar3 + (uVar18 << 0x20);
                uVar17 = uVar17 - 1;
              } while (uVar17 != 0);
              dVar24 = dVar27 * dVar26 + -dVar22;
              local_88 = local_88 + -1;
              lVar15 = lVar15 + -0x100000000;
              bVar19 = lVar9 <= (long)local_38;
              lVar3 = lVar9;
            } while ((long)local_38 < lVar9);
          }
          local_74 = local_74 + 1;
          if (((bVar19) || (dVar26 != 0.0)) || (NAN(dVar26))) {
            eval[local_38] = eval[local_38] - dVar20;
            __dest[local_38] = dVar24;
            __dest[uVar16] = 0;
          }
        }
      } while (local_38 != uVar16);
      local_38 = local_38 + 1;
      iVar4 = iVar4 + -1;
      puVar7 = puVar7 + 1;
      uVar12 = uVar12 - 1;
      pdVar10 = pdVar10 + 1;
    } while (local_38 != uVar18);
  }
  free(__dest);
  return;
}

Assistant:

void eigensystem(double *mat, int N, double *eval, double *evec) {
	double *e;

	e = (double*)calloc(N, sizeof(double));

	memcpy(evec, mat, sizeof(double)*N*N);

	tred2(evec, N, eval, e);
	tqli(eval, N, e, evec);

	free(e);
}